

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jason.c
# Opt level: O0

void StartIf(void)

{
  int iVar1;
  tokentype tokopnd;
  addressrec a;
  addressrec b;
  int iStack_1c;
  addressrec addr1;
  addressrec operand;
  optype otype;
  tokentype relop;
  
  operand.opndtype = opnvar;
  iVar1 = actionpop();
  tokopnd = actionpop();
  a = getaddress(tokopnd);
  switch(iVar1) {
  case 0x19:
    operand.opndtype = 0xe;
    break;
  default:
    break;
  case 0x1d:
    operand.opndtype = 0xb;
    break;
  case 0x1e:
    operand.opndtype = 9;
    break;
  case 0x1f:
    operand.opndtype = 0xd;
  }
  b = gettemplabel();
  nextop = genquad(operand.opndtype,a,b,(addressrec)0x4);
  iStack_1c = b.opnd;
  actionpush(iStack_1c);
  return;
}

Assistant:

void	StartIf(void)
{
    enum tokentype		relop;
    enum optype	otype = opnull;
    struct addressrec	operand, addr1;
    relop = actionpop();
    operand = getaddress(actionpop());
    switch(relop)	{
        case tokgreater:	otype = opifnegzjump; break;
        case tokless:	otype = opifposzjump; break;
        case tokequals: otype = opifnzjump; break;
        case toknotequal:	otype = opifzjump; break;
        default: break;
    }
    addr1 = gettemplabel();
    nextop = genquad(otype, operand, addr1, no_op);
    actionpush(addr1.opnd);
    
    
}